

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O0

void __thiscall SuiteSessionIDTests::TeststreamIn::RunImpl(TeststreamIn *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_720;
  string local_700;
  stringstream local_6e0 [8];
  stringstream strstream3;
  ostream local_6d0;
  TestDetails local_538;
  string local_518;
  stringstream local_4f8 [8];
  stringstream strstream2;
  ostream local_4e8;
  TestDetails local_350;
  string local_330;
  stringstream local_300 [8];
  stringstream strstream;
  ostream local_2f0;
  undefined1 local_178 [8];
  SessionID object;
  TeststreamIn *this_local;
  
  object.m_frozenString.field_2._8_8_ = this;
  FIX::SessionID::SessionID((SessionID *)local_178);
  std::__cxx11::stringstream::stringstream(local_300);
  std::operator<<(&local_2f0,"FIX.4.2:SENDER->TARGET");
  FIX::operator>>((istream *)local_300,(SessionID *)local_178);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::SessionID::toString_abi_cxx11_(&local_330,(SessionID *)local_178);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_350,*ppTVar3,0x76);
  UnitTest::CheckEqual<char[23],std::__cxx11::string>
            (pTVar1,(char (*) [23])"FIX.4.2:SENDER->TARGET",&local_330,&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::stringstream::stringstream(local_4f8);
  std::operator<<(&local_4e8,"FIX.4.2:SENDER->TARGET:QUALIFIER");
  FIX::operator>>((istream *)local_4f8,(SessionID *)local_178);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::SessionID::toString_abi_cxx11_(&local_518,(SessionID *)local_178);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_538,*ppTVar3,0x7b);
  UnitTest::CheckEqual<char[33],std::__cxx11::string>
            (pTVar1,(char (*) [33])"FIX.4.2:SENDER->TARGET:QUALIFIER",&local_518,&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::stringstream::stringstream(local_6e0);
  std::operator<<(&local_6d0,"FIX.4.2:SENDER-ID->TARGET:QUALIFIER");
  FIX::operator>>((istream *)local_6e0,(SessionID *)local_178);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::SessionID::toString_abi_cxx11_(&local_700,(SessionID *)local_178);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_720,*ppTVar3,0x80);
  UnitTest::CheckEqual<char[36],std::__cxx11::string>
            (pTVar1,(char (*) [36])"FIX.4.2:SENDER-ID->TARGET:QUALIFIER",&local_700,&local_720);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::stringstream::~stringstream(local_6e0);
  std::__cxx11::stringstream::~stringstream(local_4f8);
  std::__cxx11::stringstream::~stringstream(local_300);
  FIX::SessionID::~SessionID((SessionID *)local_178);
  return;
}

Assistant:

TEST(streamIn)
{
  SessionID object;
  std::stringstream strstream;
  strstream << "FIX.4.2:SENDER->TARGET";
  strstream >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET", object.toString() );

  std::stringstream strstream2;
  strstream2 << "FIX.4.2:SENDER->TARGET:QUALIFIER";
  strstream2 >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET:QUALIFIER", object.toString() );

  std::stringstream strstream3;
  strstream3 << "FIX.4.2:SENDER-ID->TARGET:QUALIFIER";
  strstream3 >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER-ID->TARGET:QUALIFIER", object.toString() );
}